

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

void __thiscall sf::WindowBase::setSize(WindowBase *this,Vector2u *size)

{
  undefined4 *in_RSI;
  long *in_RDI;
  
  if (in_RDI[1] != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x30))((long *)in_RDI[1],in_RSI);
    *(undefined4 *)(in_RDI + 2) = *in_RSI;
    *(undefined4 *)((long)in_RDI + 0x14) = in_RSI[1];
    (**(code **)(*in_RDI + 0x30))();
  }
  return;
}

Assistant:

void WindowBase::setSize(const Vector2u& size)
{
    if (m_impl)
    {
        m_impl->setSize(size);

        // Cache the new size
        m_size.x = size.x;
        m_size.y = size.y;

        // Notify the derived class
        onResize();
    }
}